

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

void __thiscall
FIX::Message::Message
          (Message *this,message_order *headerOrder,message_order *trailerOrder,message_order *order
          ,string *string,DataDictionary *sessionDataDictionary,
          DataDictionary *applicationDataDictionary,bool validate)

{
  bool bVar1;
  
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001f6428;
  FieldMap::FieldMap(&(this->m_header).super_FieldMap,headerOrder);
  (this->m_header).super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f6460;
  FieldMap::FieldMap(&(this->m_trailer).super_FieldMap,trailerOrder);
  (this->m_trailer).super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f6498;
  this->m_validStructure = true;
  setStringHeader(this,string);
  bVar1 = isAdmin(this);
  if (bVar1) {
    applicationDataDictionary = sessionDataDictionary;
  }
  setString(this,string,validate,sessionDataDictionary,applicationDataDictionary);
  return;
}

Assistant:

Message::Message(
    const message_order &headerOrder,
    const message_order &trailerOrder,
    const message_order &order,
    const std::string &string,
    const DataDictionary &sessionDataDictionary,
    const DataDictionary &applicationDataDictionary,
    bool validate) EXCEPT(InvalidMessage)
    : FieldMap(order),
      m_header(headerOrder),
      m_trailer(trailerOrder),
      m_validStructure(true) {
  setStringHeader(string);
  if (isAdmin()) {
    setString(string, validate, &sessionDataDictionary, &sessionDataDictionary);
  } else {
    setString(string, validate, &sessionDataDictionary, &applicationDataDictionary);
  }
}